

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreply.cpp
# Opt level: O0

void QNetworkReply::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  ulong _t1;
  QMetaType QVar2;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QNetworkReply *_t;
  undefined4 in_stack_fffffffffffffec8;
  NetworkError in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  QMetaType local_38;
  QMetaTypeInterface *local_30;
  QMetaType local_28;
  QMetaTypeInterface *local_20;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    _t1 = (ulong)in_EDX;
    switch(_t1) {
    case 0:
      socketStartedConnecting((QNetworkReply *)0x1e3401);
      break;
    case 1:
      requestSent((QNetworkReply *)0x1e3413);
      break;
    case 2:
      metaDataChanged((QNetworkReply *)0x1e3425);
      break;
    case 3:
      finished((QNetworkReply *)0x1e3437);
      break;
    case 4:
      errorOccurred((QNetworkReply *)0x1e3457,in_stack_fffffffffffffecc);
      break;
    case 5:
      encrypted((QNetworkReply *)0x1e3469);
      break;
    case 6:
      sslErrors((QNetworkReply *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (QList<QSslError> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      break;
    case 7:
      preSharedKeyAuthenticationRequired
                ((QNetworkReply *)0x1e34a8,
                 (QSslPreSharedKeyAuthenticator *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      break;
    case 8:
      redirected((QNetworkReply *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (QUrl *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      break;
    case 9:
      redirectAllowed((QNetworkReply *)0x1e34d8);
      break;
    case 10:
      uploadProgress((QNetworkReply *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     _t1,CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      break;
    case 0xb:
      downloadProgress((QNetworkReply *)
                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),_t1,
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      break;
    case 0xc:
      (**(code **)(*in_RDI + 0xf0))();
      break;
    case 0xd:
      (**(code **)(*in_RDI + 0xf8))();
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 4) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_20 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = local_20;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
    }
    else if (in_EDX == 6) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_30 = (QMetaTypeInterface *)QMetaType::fromType<QList<QSslError>>();
        **(undefined8 **)in_RCX = local_30;
      }
      else {
        memset(&local_28,0,8);
        QMetaType::QMetaType(&local_28);
        **(undefined8 **)in_RCX = local_28.d_ptr;
      }
    }
    else if (in_EDX == 7) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar2 = QMetaType::fromType<QSslPreSharedKeyAuthenticator*>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)in_RCX = local_38.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if (((((in_ESI == 5) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                           (in_RCX,(void **)socketStartedConnecting,0,0), !bVar1)) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                          (in_RCX,(void **)requestSent,0,1), !bVar1)) &&
      ((((bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                            (in_RCX,(void **)metaDataChanged,0,2), !bVar1 &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                            (in_RCX,(void **)finished,0,3), !bVar1)) &&
        ((bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(QNetworkReply::NetworkError)>
                            (in_RCX,(void **)errorOccurred,0,4), !bVar1 &&
         ((bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                             (in_RCX,(void **)encrypted,0,5), !bVar1 &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(QList<QSslError>const&)>
                             (in_RCX,(void **)sslErrors,0,6), !bVar1)))))) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(QSslPreSharedKeyAuthenticator*)>
                          (in_RCX,(void **)preSharedKeyAuthenticationRequired,0,7), !bVar1)))) &&
     (((bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(QUrl_const&)>
                          (in_RCX,(void **)redirected,0,8), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)()>
                          (in_RCX,(void **)redirectAllowed,0,9), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(long_long,long_long)>
                         (in_RCX,(void **)uploadProgress,0,10), !bVar1)))) {
    QtMocHelpers::indexOfMethod<void(QNetworkReply::*)(long_long,long_long)>
              (in_RCX,(void **)downloadProgress,0,0xb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReply::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkReply *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->socketStartedConnecting(); break;
        case 1: _t->requestSent(); break;
        case 2: _t->metaDataChanged(); break;
        case 3: _t->finished(); break;
        case 4: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 5: _t->encrypted(); break;
        case 6: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 7: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 8: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 9: _t->redirectAllowed(); break;
        case 10: _t->uploadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 11: _t->downloadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 12: _t->abort(); break;
        case 13: _t->ignoreSslErrors(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::socketStartedConnecting, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::requestSent, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::metaDataChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::finished, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(QNetworkReply::NetworkError )>(_a, &QNetworkReply::errorOccurred, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::encrypted, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(const QList<QSslError> & )>(_a, &QNetworkReply::sslErrors, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QNetworkReply::preSharedKeyAuthenticationRequired, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(const QUrl & )>(_a, &QNetworkReply::redirected, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::redirectAllowed, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(qint64 , qint64 )>(_a, &QNetworkReply::uploadProgress, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(qint64 , qint64 )>(_a, &QNetworkReply::downloadProgress, 11))
            return;
    }
}